

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<long,_long,_duckdb::ParquetTimestampNSOperator>::StandardColumnWriter
          (StandardColumnWriter<long,_long,_duckdb::ParquetTimestampNSOperator> *this,
          ParquetWriter *writer,ParquetColumnSchema *column_schema,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *schema_path_p,bool can_have_nulls)

{
  byte bVar1;
  ParquetColumnSchema *in_RCX;
  ParquetWriter *in_RDX;
  PrimitiveColumnWriter *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RDI;
  byte in_R8B;
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector(in_RDI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)in_RCX);
  PrimitiveColumnWriter::PrimitiveColumnWriter
            (in_RSI,in_RDX,in_RCX,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(bool)in_stack_ffffffffffffffd7);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x5dfb78);
  (in_RDI->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__StandardColumnWriter_00bfc7b0;
  return;
}

Assistant:

StandardColumnWriter(ParquetWriter &writer, const ParquetColumnSchema &column_schema,
	                     vector<string> schema_path_p, // NOLINT
	                     bool can_have_nulls)
	    : PrimitiveColumnWriter(writer, column_schema, std::move(schema_path_p), can_have_nulls) {
	}